

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpolynomial.cpp
# Opt level: O0

void __thiscall TPZPolynomial::TPZPolynomial(TPZPolynomial *this,TPZVec<double> *coef)

{
  TPZPolynomial *in_RSI;
  TPZVec<double> *in_RDI;
  double **size;
  TPZVec<double> *in_stack_ffffffffffffffe8;
  
  size = &in_RDI->fStore;
  TPZVec<double>::TPZVec(in_RDI,(int64_t)size);
  TPZVec<double>::TPZVec(in_RDI,(int64_t)size);
  in_RDI[2].fStore = (double *)0x0;
  SetCoef(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

TPZPolynomial::TPZPolynomial(const TPZVec<REAL> &coef): fCo(4), fReal(3), fImagem(0.0) {
    SetCoef(coef);
}